

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall
helics::TimeCoordinator::setProperty(TimeCoordinator *this,int intProperty,int propertyVal)

{
  if (intProperty == 0x103) {
    (this->info).maxIterations = propertyVal;
    return;
  }
  setProperty(this,intProperty,
              (Time)(long)((double)propertyVal * 1000000000.0 +
                          *(double *)
                           (&DAT_0042cab0 + (ulong)(0.0 <= (double)propertyVal * 1000000000.0) * 8))
             );
  return;
}

Assistant:

void TimeCoordinator::setProperty(int intProperty, int propertyVal)
{
    if (intProperty == defs::Properties::MAX_ITERATIONS) {
        info.maxIterations = propertyVal;
    } else {
        setProperty(intProperty, Time(static_cast<double>(propertyVal)));
    }
}